

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

Expression *
slang::ast::ReplicationExpression::fromSyntax
          (Compilation *compilation,MultipleConcatenationExpressionSyntax *syntax,
          ASTContext *context)

{
  ExpressionSyntax *syntax_00;
  ConcatenationExpressionSyntax *pCVar1;
  SourceRange range;
  SourceRange sourceRange;
  bool bVar2;
  bitwidth_t value;
  Type *pTVar3;
  Expression *pEVar4;
  Type *expr;
  SourceLocation location;
  Diagnostic *diag;
  Diagnostic *diag_00;
  optional<int> value_00;
  optional<unsigned_int> oVar5;
  Type *pTVar6;
  char *func;
  _Storage<int,_true> _Var7;
  Type *pTVar8;
  SourceRange SVar9;
  Token TVar10;
  Expression *right;
  ConstantValue leftVal;
  EvalContext evalCtx;
  Expression *local_2a8;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_2a0;
  uint local_298;
  byte local_293;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_290;
  uint local_288;
  ushort local_284;
  Type *local_280;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_278;
  char local_258;
  undefined1 local_250 [12];
  uint32_t uStack_244;
  undefined4 uStack_240;
  undefined8 uStack_23c;
  undefined4 local_234;
  SmallVectorBase<slang::ast::EvalContext::Frame> local_230;
  LValue **local_178;
  size_type local_170;
  size_type local_168;
  LValue *local_160 [5];
  SmallVectorBase<slang::Diagnostic> local_138;
  SourceLocation local_40;
  SourceLocation SStack_38;
  
  syntax_00 = (syntax->expression).ptr;
  if (syntax_00 == (ExpressionSyntax *)0x0) {
    func = 
    "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
    ;
    goto LAB_003aff43;
  }
  pTVar3 = (Type *)Expression::selfDetermined
                             (compilation,syntax_00,context,(bitmask<slang::ast::ASTFlags>)0x0);
  pCVar1 = (syntax->concatenation).ptr;
  if (pCVar1 == (ConcatenationExpressionSyntax *)0x0) {
LAB_003aff00:
    func = 
    "T slang::not_null<slang::syntax::ConcatenationExpressionSyntax *>::get() const [T = slang::syntax::ConcatenationExpressionSyntax *]"
    ;
    goto LAB_003aff43;
  }
  pEVar4 = Expression::create(compilation,(ExpressionSyntax *)pCVar1,context,
                              (bitmask<slang::ast::ASTFlags>)0x0,(Type *)0x0);
  pTVar6 = compilation->errorType;
  local_2a8 = pEVar4;
  SVar9 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  local_250._0_8_ = SVar9.startLoc;
  local_250._8_4_ = SVar9.endLoc._0_4_;
  uStack_244 = SVar9.endLoc._4_4_;
  expr = (Type *)BumpAllocator::
                 emplace<slang::ast::ReplicationExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
                           (&compilation->super_BumpAllocator,pTVar6,(Expression *)pTVar3,pEVar4,
                            (SourceRange *)local_250);
  bVar2 = Expression::bad((Expression *)pTVar3);
  if ((bVar2) || (bVar2 = Expression::bad(local_2a8), bVar2)) goto LAB_003afc55;
  pTVar8 = (Type *)(pTVar3->super_Symbol).name._M_len;
  if (pTVar8 != (Type *)0x0) {
    bVar2 = Type::isIntegral(pTVar8);
    if (bVar2) {
      pTVar8 = (local_2a8->type).ptr;
      if (pTVar8 != (Type *)0x0) {
        bVar2 = Type::isIntegral(pTVar8);
        if (!bVar2) {
          pTVar6 = (local_2a8->type).ptr;
          if (pTVar6 == (Type *)0x0) goto LAB_003aff2e;
          if (pTVar6->canonical == (Type *)0x0) {
            Type::resolveCanonical(pTVar6);
          }
          if ((pTVar6->canonical->super_Symbol).kind != StringType) goto LAB_003afbca;
        }
        local_230.data_ = (pointer)local_230.firstElement;
        local_250[8] = 2;
        uStack_244 = 0;
        uStack_240 = 0;
        uStack_23c = 0;
        local_234 = 0;
        local_230.len = 0;
        local_230.cap = 2;
        local_178 = local_160;
        local_170 = 0;
        local_168 = 5;
        local_138.data_ = (pointer)local_138.firstElement;
        local_138.len = 0;
        local_138.cap = 2;
        local_40 = (SourceLocation)0x0;
        SStack_38 = (SourceLocation)0x0;
        pTVar8 = pTVar3;
        local_280 = expr;
        local_250._0_8_ = compilation;
        Expression::eval((ConstantValue *)&local_278,(Expression *)pTVar3,(EvalContext *)local_250);
        if (local_258 == '\0') {
          bVar2 = Expression::isImplicitString(local_2a8);
          pTVar6 = local_280;
          if (bVar2) {
            pTVar8 = (Type *)&local_2a8;
            Expression::contextDetermined
                      (context,(Expression **)pTVar8,compilation->stringType,(SourceLocation)0x0);
            (pTVar6->super_Symbol).originatingSyntax = (SyntaxNode *)local_2a8;
            if (compilation->stringType == (Type *)0x0) {
              assert::assertFailed
                        ("ptr",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                         ,0x1b,
                         "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = const slang::ast::Type *]"
                        );
            }
            (pTVar6->super_Symbol).name._M_len = (size_t)compilation->stringType;
          }
          else {
            EvalContext::reportDiags((EvalContext *)local_250,context);
            pTVar8 = pTVar6;
            pTVar6 = (Type *)Expression::badExpr(compilation,(Expression *)pTVar6);
          }
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_278);
        if (local_258 == '\0') goto LAB_003afec5;
        pTVar8 = pTVar3;
        value_00 = ASTContext::evalInteger(context,(Expression *)pTVar3);
        pTVar6 = local_280;
        if (((ulong)value_00.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
          _Var7._M_value =
               value_00.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>._M_payload;
          if (-1 < _Var7._M_value) {
            if (_Var7._M_value == 0) {
              if (((context->flags).m_bits & 1) == 0) {
                sourceRange.startLoc = (SourceLocation)(pTVar3->super_Symbol).parentScope;
                sourceRange.endLoc = (SourceLocation)(pTVar3->super_Symbol).nextInScope;
                ASTContext::addDiag(context,(DiagCode)0x820007,sourceRange);
                goto LAB_003afd6e;
              }
              pTVar3 = compilation->voidType;
              if (pTVar3 == (Type *)0x0) {
                assert::assertFailed
                          ("ptr",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                           ,0x1b,
                           "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = const slang::ast::Type *]"
                          );
              }
            }
            else {
              pTVar8 = (Type *)&local_2a8;
              Expression::selfDetermined(context,(Expression **)pTVar8);
              (pTVar6->super_Symbol).originatingSyntax = (SyntaxNode *)local_2a8;
              pTVar3 = (local_2a8->type).ptr;
              if (pTVar3 == (Type *)0x0) {
                assert::assertFailed
                          ("ptr",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                           ,0x26,
                           "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                          );
              }
              if (pTVar3->canonical == (Type *)0x0) {
                Type::resolveCanonical(pTVar3);
              }
              if ((pTVar3->canonical->super_Symbol).kind == StringType) {
                pTVar3 = compilation->stringType;
                if (pTVar3 == (Type *)0x0) {
                  assert::assertFailed
                            ("ptr",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                             ,0x1b,
                             "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = const slang::ast::Type *]"
                            );
                }
              }
              else {
                local_290._0_4_ = _Var7._M_value & 0x7fffffff;
                local_290.val._4_4_ = 0;
                local_288 = 0x20;
                local_284 = 1;
                SVInt::clearUnusedBits((SVInt *)&local_290);
                pTVar3 = (local_2a8->type).ptr;
                if (pTVar3 == (Type *)0x0) {
                  assert::assertFailed
                            ("ptr",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                             ,0x26,
                             "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                            );
                }
                value = Type::getBitWidth(pTVar3);
                SVInt::SVInt<unsigned_int,void>((SVInt *)&local_2a0,value);
                SVInt::operator*((SVInt *)&local_278,(SVInt *)&local_290);
                SVar9 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
                oVar5 = ASTContext::requireValidBitWidth(context,(SVInt *)&local_278,SVar9);
                if (((0x40 < (uint)local_278._8_4_) || ((local_278._13_1_ & 1) != 0)) &&
                   ((void *)local_278._0_8_ != (void *)0x0)) {
                  operator_delete__((void *)local_278._0_8_);
                }
                if (((0x40 < local_298) || ((local_293 & 1) != 0)) &&
                   ((void *)local_2a0.val != (void *)0x0)) {
                  operator_delete__(local_2a0.pVal);
                }
                if (((0x40 < local_288) || ((local_284 & 0x100) != 0)) &&
                   ((SourceLocation)local_290.val != (SourceLocation)0x0)) {
                  operator_delete__(local_290.pVal);
                }
                if (((ulong)oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) {
                  pTVar8 = pTVar6;
                  pTVar6 = (Type *)Expression::badExpr(compilation,(Expression *)pTVar6);
                  goto LAB_003afec5;
                }
                pTVar3 = (local_2a8->type).ptr;
                if (pTVar3 == (Type *)0x0) {
                  assert::assertFailed
                            ("ptr",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                             ,0x26,
                             "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                            );
                }
                bVar2 = Type::isFourState(pTVar3);
                pTVar8 = (Type *)((ulong)oVar5.super__Optional_base<unsigned_int,_true,_true>.
                                         _M_payload.super__Optional_payload_base<unsigned_int> &
                                 0xffffffff);
                pTVar3 = Compilation::getType
                                   (compilation,
                                    oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                    super__Optional_payload_base<unsigned_int>._M_payload,
                                    (bitmask<slang::ast::IntegralFlags>)(bVar2 * '\x02'));
              }
            }
            (pTVar6->super_Symbol).name._M_len = (size_t)pTVar3;
            goto LAB_003afec5;
          }
          range.startLoc = (SourceLocation)(pTVar3->super_Symbol).parentScope;
          range.endLoc = (SourceLocation)(pTVar3->super_Symbol).nextInScope;
          ASTContext::requireGtZero(context,value_00,range);
        }
LAB_003afd6e:
        pTVar8 = pTVar6;
        pTVar6 = (Type *)Expression::badExpr(compilation,(Expression *)pTVar6);
LAB_003afec5:
        SmallVectorBase<slang::Diagnostic>::cleanup(&local_138,(EVP_PKEY_CTX *)pTVar8);
        if (local_178 != local_160) {
          free(local_178);
        }
        SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup(&local_230,(EVP_PKEY_CTX *)pTVar8);
        return (Expression *)pTVar6;
      }
    }
    else {
LAB_003afbca:
      pCVar1 = (syntax->concatenation).ptr;
      if (pCVar1 == (ConcatenationExpressionSyntax *)0x0) goto LAB_003aff00;
      TVar10 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)pCVar1);
      local_250._0_8_ = TVar10._0_8_;
      local_250._8_4_ = TVar10.info._0_4_;
      uStack_244 = TVar10.info._4_4_;
      location = parsing::Token::location((Token *)local_250);
      diag = ASTContext::addDiag(context,(DiagCode)0x250007,location);
      pTVar6 = (Type *)(pTVar3->super_Symbol).name._M_len;
      if (pTVar6 != (Type *)0x0) {
        diag_00 = ast::operator<<(diag,pTVar6);
        pTVar6 = (local_2a8->type).ptr;
        if (pTVar6 != (Type *)0x0) {
          ast::operator<<(diag_00,pTVar6);
          SVar9.startLoc = (SourceLocation)(pTVar3->super_Symbol).parentScope;
          SVar9.endLoc = (SourceLocation)(pTVar3->super_Symbol).nextInScope;
          Diagnostic::operator<<(diag,SVar9);
          Diagnostic::operator<<(diag,local_2a8->sourceRange);
LAB_003afc55:
          pEVar4 = Expression::badExpr(compilation,(Expression *)expr);
          return pEVar4;
        }
      }
    }
  }
LAB_003aff2e:
  func = "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
LAB_003aff43:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

Expression& ReplicationExpression::fromSyntax(Compilation& compilation,
                                              const MultipleConcatenationExpressionSyntax& syntax,
                                              const ASTContext& context) {
    Expression& left = selfDetermined(compilation, *syntax.expression, context);
    Expression* right = &create(compilation, *syntax.concatenation, context);

    auto result = compilation.emplace<ReplicationExpression>(compilation.getErrorType(), left,
                                                             *right, syntax.sourceRange());
    if (left.bad() || right->bad())
        return badExpr(compilation, result);

    if (!left.type->isIntegral() || (!right->type->isIntegral() && !right->type->isString())) {
        auto& diag = context.addDiag(diag::BadReplicationExpression,
                                     syntax.concatenation->getFirstToken().location());
        diag << *left.type << *right->type;
        diag << left.sourceRange;
        diag << right->sourceRange;
        return badExpr(compilation, result);
    }

    // If the multiplier isn't constant this must be a string replication.
    EvalContext evalCtx(compilation, EvalFlags::CacheResults);
    if (ConstantValue leftVal = left.eval(evalCtx); !leftVal) {
        if (!right->isImplicitString()) {
            // They probably meant for this to be a constant (non-string) replication,
            // so do the normal error reporting for that case.
            evalCtx.reportDiags(context);
            return badExpr(compilation, result);
        }

        contextDetermined(context, right, compilation.getStringType());

        result->concat_ = right;
        result->type = &compilation.getStringType();
        return *result;
    }

    std::optional<int32_t> count = context.evalInteger(left);
    if (!count)
        return badExpr(compilation, result);

    if (*count < 0) {
        context.requireGtZero(count, left.sourceRange);
        return badExpr(compilation, result);
    }

    if (*count == 0) {
        if ((context.flags & ASTFlags::InsideConcatenation) == 0) {
            context.addDiag(diag::ReplicationZeroOutsideConcat, left.sourceRange);
            return badExpr(compilation, result);
        }

        // Use a placeholder type here to indicate to the parent concatenation that this had a
        // zero width.
        result->type = &compilation.getVoidType();
        return *result;
    }

    selfDetermined(context, right);
    result->concat_ = right;

    if (right->type->isString()) {
        result->type = &compilation.getStringType();
        return *result;
    }

    auto width = context.requireValidBitWidth(
        SVInt(32, uint64_t(*count), true) * right->type->getBitWidth(), syntax.sourceRange());
    if (!width)
        return badExpr(compilation, result);

    result->type = &compilation.getType(*width, right->type->isFourState()
                                                    ? IntegralFlags::FourState
                                                    : IntegralFlags::TwoState);
    return *result;
}